

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imleDemoNoTemplates.cpp
# Opt level: O1

void demo3(void)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  ulong uVar3;
  long lVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  Param param;
  IMLE imleObj;
  Param local_4a0;
  IMLE local_3f8;
  
  IMLE::Param::Param(&local_4a0,1,1);
  if (local_4a0.Psi0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
      != 1) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              (&local_4a0.Psi0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,1,1);
  }
  auVar2 = _DAT_0018b020;
  auVar1 = _DAT_0018b010;
  if (0 < local_4a0.Psi0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
          m_rows) {
    uVar3 = local_4a0.Psi0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
            m_rows + 0x1fffffffffffffffU & 0x1fffffffffffffff;
    auVar5._8_4_ = (int)uVar3;
    auVar5._0_8_ = uVar3;
    auVar5._12_4_ = (int)(uVar3 >> 0x20);
    lVar4 = 0;
    auVar5 = auVar5 ^ _DAT_0018b020;
    do {
      auVar6._8_4_ = (int)lVar4;
      auVar6._0_8_ = lVar4;
      auVar6._12_4_ = (int)((ulong)lVar4 >> 0x20);
      auVar6 = (auVar6 | auVar1) ^ auVar2;
      if ((bool)(~(auVar6._4_4_ == auVar5._4_4_ && auVar5._0_4_ < auVar6._0_4_ ||
                  auVar5._4_4_ < auVar6._4_4_) & 1)) {
        local_4a0.Psi0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
        m_data[lVar4] = 0.1;
      }
      if ((auVar6._12_4_ != auVar5._12_4_ || auVar6._8_4_ <= auVar5._8_4_) &&
          auVar6._12_4_ <= auVar5._12_4_) {
        local_4a0.Psi0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
        m_data[lVar4 + 1] = 0.1;
      }
      lVar4 = lVar4 + 2;
    } while ((uVar3 - ((uint)(local_4a0.Psi0.
                              super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                              m_storage.m_rows + 0x1fffffffffffffffU) & 1)) + 2 != lVar4);
  }
  local_4a0.sigma0 = 1.0;
  local_4a0.p0 = 0.3;
  IMLE::IMLE(&local_3f8,1,1,&local_4a0,0x800);
  doubleCos1D_train<IMLE>(&local_3f8,2000);
  doubleCos1D_eval<IMLE>(&local_3f8);
  IMLE::~IMLE(&local_3f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4a0.defaultSave._M_dataplus._M_p != &local_4a0.defaultSave.field_2) {
    operator_delete(local_4a0.defaultSave._M_dataplus._M_p);
  }
  free(local_4a0.Psi0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
       m_data);
  return;
}

Assistant:

void demo3()
{
    int d = 1;    //Input dimension
    int D = 1;    //Output dimension

    //      IMLE Parameters
    IMLE::Param param(d,D);
    param.Psi0 = IMLE::X::Constant(D,0.1);
    param.sigma0 = 1.0;
    param.p0 = 0.3;

    // IMLE object
    IMLE imleObj(d,D,param);

    doubleCos1D_train( imleObj );
    doubleCos1D_eval( imleObj );
}